

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginDisabled(bool disabled)

{
  int *piVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ImGuiContext *pIVar6;
  int *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  
  pIVar6 = GImGui;
  uVar3 = GImGui->CurrentItemFlags;
  if ((char)((uVar3 & 4) >> 2) == '\0' && disabled) {
    fVar2 = (GImGui->Style).Alpha;
    GImGui->DisabledAlphaBackup = fVar2;
    (pIVar6->Style).Alpha = fVar2 * (pIVar6->Style).DisabledAlpha;
  }
  if ((uVar3 & 4) != 0 || disabled) {
    pIVar6->CurrentItemFlags = uVar3 | 4;
  }
  iVar8 = (pIVar6->ItemFlagsStack).Size;
  iVar4 = (pIVar6->ItemFlagsStack).Capacity;
  if (iVar8 == iVar4) {
    iVar8 = iVar8 + 1;
    if (iVar4 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar4 / 2 + iVar4;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar4 < iVar8) {
      if (pIVar6 != (ImGuiContext *)0x0) {
        piVar5 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + 1;
      }
      __dest = (int *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
      piVar5 = (pIVar6->ItemFlagsStack).Data;
      if (piVar5 != (int *)0x0) {
        memcpy(__dest,piVar5,(long)(pIVar6->ItemFlagsStack).Size << 2);
        piVar5 = (pIVar6->ItemFlagsStack).Data;
        if ((piVar5 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(piVar5,GImAllocatorUserData);
      }
      (pIVar6->ItemFlagsStack).Data = __dest;
      (pIVar6->ItemFlagsStack).Capacity = iVar8;
    }
  }
  (pIVar6->ItemFlagsStack).Data[(pIVar6->ItemFlagsStack).Size] = pIVar6->CurrentItemFlags;
  (pIVar6->ItemFlagsStack).Size = (pIVar6->ItemFlagsStack).Size + 1;
  pIVar6->DisabledStackSize = pIVar6->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}